

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void google::protobuf::internal::anon_unknown_26::Register(ExtensionInfo *info)

{
  __node_base *p_Var1;
  size_type *psVar2;
  __node_base_ptr p_Var3;
  __buckets_ptr pp_Var4;
  _Hash_node_base *p_Var5;
  int iVar6;
  _Hash_node_base *p_Var7;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var8;
  LogMessage *pLVar9;
  unordered_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
  *puVar10;
  _Hash_node_base *p_Var11;
  ulong uVar12;
  size_type __n;
  pointer __ptr_1;
  __node_base _Var13;
  ulong uVar14;
  _Hash_node_base *p_Var15;
  _Hash_node_base *p_Var16;
  undefined1 auVar17 [16];
  __buckets_alloc_type __alloc;
  LogFinisher local_91;
  size_t local_90;
  string local_88;
  LogMessage local_68;
  
  if (((anonymous_namespace)::Register(google::protobuf::internal::ExtensionInfo_const&)::
       local_static_registry == '\0') &&
     (iVar6 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   Register(google::protobuf::internal::ExtensionInfo_const&)::
                                   local_static_registry), iVar6 != 0)) {
    puVar10 = (unordered_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
               *)operator_new(0x38);
    (puVar10->_M_h)._M_buckets = &(puVar10->_M_h)._M_single_bucket;
    (puVar10->_M_h)._M_bucket_count = 1;
    (puVar10->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (puVar10->_M_h)._M_element_count = 0;
    (puVar10->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
    (puVar10->_M_h)._M_rehash_policy._M_next_resize = 0;
    (puVar10->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
    OnShutdownRun(OnShutdownDelete<std::unordered_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>_>
                  ::anon_class_1_0_00000001::__invoke,puVar10);
    Register::local_static_registry = puVar10;
    __cxa_guard_release(&(anonymous_namespace)::
                         Register(google::protobuf::internal::ExtensionInfo_const&)::
                         local_static_registry);
  }
  puVar10 = Register::local_static_registry;
  (anonymous_namespace)::global_registry = Register::local_static_registry;
  p_Var16 = (_Hash_node_base *)((long)info->number ^ (ulong)info->message);
  uVar14 = (Register::local_static_registry->_M_h)._M_bucket_count;
  uVar12 = (ulong)p_Var16 % uVar14;
  p_Var3 = (Register::local_static_registry->_M_h)._M_buckets[uVar12];
  if (p_Var3 != (__node_base_ptr)0x0) {
    p_Var15 = p_Var3->_M_nxt;
    p_Var11 = p_Var15[6]._M_nxt;
    do {
      if (((p_Var11 == p_Var16) && ((MessageLite *)p_Var15[1]._M_nxt == info->message)) &&
         (*(int *)&p_Var15[2]._M_nxt == info->number)) {
        LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                   ,0x75);
        pLVar9 = LogMessage::operator<<(&local_68,"Multiple extension registrations for type \"");
        (*info->message->_vptr_MessageLite[2])(&local_88);
        pLVar9 = LogMessage::operator<<(pLVar9,&local_88);
        pLVar9 = LogMessage::operator<<(pLVar9,"\", field number ");
        pLVar9 = LogMessage::operator<<(pLVar9,info->number);
        pLVar9 = LogMessage::operator<<(pLVar9,".");
        LogFinisher::operator=(&local_91,pLVar9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
        LogMessage::~LogMessage(&local_68);
        return;
      }
      p_Var15 = p_Var15->_M_nxt;
    } while ((p_Var15 != (_Hash_node_base *)0x0) &&
            (p_Var11 = p_Var15[6]._M_nxt, (ulong)p_Var11 % uVar14 == uVar12));
  }
  p_Var7 = (_Hash_node_base *)operator_new(0x38);
  p_Var7->_M_nxt = (_Hash_node_base *)0x0;
  p_Var15 = *(_Hash_node_base **)&info->number;
  p_Var11 = (_Hash_node_base *)(info->field_5).enum_validity_check.func;
  p_Var5 = (_Hash_node_base *)(info->field_5).enum_validity_check.arg;
  p_Var7[1]._M_nxt = (_Hash_node_base *)info->message;
  p_Var7[2]._M_nxt = p_Var15;
  p_Var7[3]._M_nxt = p_Var11;
  p_Var7[4]._M_nxt = p_Var5;
  p_Var7[5]._M_nxt = (_Hash_node_base *)info->descriptor;
  local_90 = (puVar10->_M_h)._M_rehash_policy._M_next_resize;
  auVar17 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                      ((ulong)&(puVar10->_M_h)._M_rehash_policy,(puVar10->_M_h)._M_bucket_count,
                       (puVar10->_M_h)._M_element_count);
  __n = auVar17._8_8_;
  if ((auVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    __s = (puVar10->_M_h)._M_buckets;
  }
  else {
    if (__n == 1) {
      __s = &(puVar10->_M_h)._M_single_bucket;
      (puVar10->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
    }
    else {
      __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                      ((new_allocator<std::__detail::_Hash_node_base_*> *)&local_68,__n,(void *)0x0)
      ;
      memset(__s,0,__n * 8);
    }
    _Var13._M_nxt = (puVar10->_M_h)._M_before_begin._M_nxt;
    (puVar10->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    if (_Var13._M_nxt != (_Hash_node_base *)0x0) {
      p_Var1 = &(puVar10->_M_h)._M_before_begin;
      uVar14 = 0;
      do {
        p_Var15 = (_Var13._M_nxt)->_M_nxt;
        uVar12 = (ulong)_Var13._M_nxt[6]._M_nxt % __n;
        if (__s[uVar12] == (__node_base_ptr)0x0) {
          (_Var13._M_nxt)->_M_nxt = p_Var1->_M_nxt;
          p_Var1->_M_nxt = _Var13._M_nxt;
          __s[uVar12] = p_Var1;
          if ((_Var13._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
            pp_Var8 = __s + uVar14;
            goto LAB_003c4eb4;
          }
        }
        else {
          (_Var13._M_nxt)->_M_nxt = __s[uVar12]->_M_nxt;
          pp_Var8 = &__s[uVar12]->_M_nxt;
          uVar12 = uVar14;
LAB_003c4eb4:
          *pp_Var8 = _Var13._M_nxt;
        }
        _Var13._M_nxt = p_Var15;
        uVar14 = uVar12;
      } while (p_Var15 != (_Hash_node_base *)0x0);
    }
    pp_Var4 = (puVar10->_M_h)._M_buckets;
    if (&(puVar10->_M_h)._M_single_bucket != pp_Var4) {
      operator_delete(pp_Var4);
    }
    (puVar10->_M_h)._M_bucket_count = __n;
    (puVar10->_M_h)._M_buckets = __s;
    uVar12 = (ulong)p_Var16 % __n;
  }
  p_Var7[6]._M_nxt = p_Var16;
  if (__s[uVar12] == (__node_base_ptr)0x0) {
    p_Var16 = (puVar10->_M_h)._M_before_begin._M_nxt;
    p_Var7->_M_nxt = p_Var16;
    (puVar10->_M_h)._M_before_begin._M_nxt = p_Var7;
    if (p_Var16 != (_Hash_node_base *)0x0) {
      __s[(ulong)p_Var16[6]._M_nxt % (puVar10->_M_h)._M_bucket_count] = p_Var7;
      __s = (puVar10->_M_h)._M_buckets;
    }
    __s[uVar12] = &(puVar10->_M_h)._M_before_begin;
  }
  else {
    p_Var7->_M_nxt = __s[uVar12]->_M_nxt;
    __s[uVar12]->_M_nxt = p_Var7;
  }
  psVar2 = &(puVar10->_M_h)._M_element_count;
  *psVar2 = *psVar2 + 1;
  return;
}

Assistant:

void Register(const ExtensionInfo& info) {
  static auto local_static_registry = OnShutdownDelete(new ExtensionRegistry);
  global_registry = local_static_registry;
  if (!InsertIfNotPresent(local_static_registry, info)) {
    GOOGLE_LOG(FATAL) << "Multiple extension registrations for type \""
               << info.message->GetTypeName() << "\", field number "
               << info.number << ".";
  }
}